

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doit.cpp
# Opt level: O2

void getcoverages(vector<float,_std::allocator<float>_> *coverages)

{
  undefined8 in_RAX;
  FILE *__stream;
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  undefined8 uStack_38;
  OASIS_FLOAT tiv;
  
  uStack_38 = in_RAX;
  __stream = fopen("input/coverages.bin","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    fseek(__stream,0,0);
    std::vector<float,_std::allocator<float>_>::resize(coverages,(ulong)((int)(uVar1 >> 2) + 1));
    lVar3 = 4;
    while( true ) {
      sVar2 = fread(&tiv,4,1,__stream);
      if (sVar2 == 0) break;
      *(OASIS_FLOAT *)
       ((long)(coverages->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start + lVar3) = tiv;
      lVar3 = lVar3 + 4;
    }
    fclose(__stream);
    return;
  }
  fprintf(_stderr,"FATAL: %s: Error reading file %s\n","getcoverages","input/coverages.bin");
  exit(-1);
}

Assistant:

void getcoverages(std::vector<OASIS_FLOAT> &coverages)
{
	FILE *fin = fopen(COVERAGES_FILE, "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error reading file %s\n", __func__, COVERAGES_FILE);
		exit(-1);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);

	OASIS_FLOAT tiv;
	unsigned int nrec = static_cast<unsigned int>(sz / sizeof(tiv));

	coverages.resize(nrec + 1);
	int coverage_id = 0;
	size_t i = fread(&tiv, sizeof(tiv), 1, fin);
	while (i != 0) {
		coverage_id++;
		coverages[coverage_id] = tiv;
		i = fread(&tiv, sizeof(tiv), 1, fin);
	}

	fclose(fin);

}